

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3023be::ArgParser::argPositional(ArgParser *this,string *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->gave_input == false) {
    QPDFJob::Config::inputFile
              ((this->c_main).super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,arg);
    this->gave_input = true;
  }
  else if (this->gave_output == false) {
    QPDFJob::Config::outputFile
              ((this->c_main).super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,arg);
    this->gave_output = true;
  }
  else {
    std::operator+(&local_30,"unknown argument ",arg);
    QPDFArgParser::usage(&this->ap,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void
ArgParser::argPositional(std::string const& arg)
{
    if (!this->gave_input) {
        c_main->inputFile(arg);
        this->gave_input = true;
    } else if (!this->gave_output) {
        c_main->outputFile(arg);
        this->gave_output = true;
    } else {
        usage("unknown argument " + arg);
    }
}